

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestPathWithCurrentDirectory::Run(GraphTestPathWithCurrentDirectory *this)

{
  VirtualFileSystem *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule catdep\n  depfile = $out.d\n  command = cat $in > $out\nbuild ./out.o: catdep ./foo.cc\n"
              ,(ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"foo.cc",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    this_00 = &(this->super_GraphTest).fs_;
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out.o.d",&local_62);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"out.o: foo.cc\n",&local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out.o",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pTVar2 = g_current_test;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out.o",&local_62);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
    bVar3 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,pNVar4,&local_40);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0xc4,"scan_.RecomputeDirty(GetNode(\"out.o\"), &err)");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_40);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0xc5,"\"\" == err");
    pTVar2 = g_current_test;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out.o",&local_62);
      pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
      testing::Test::Check
                (pTVar2,(bool)(pNVar4->dirty_ ^ 1),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,199,"GetNode(\"out.o\")->dirty()");
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, PathWithCurrentDirectory) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule catdep\n"
"  depfile = $out.d\n"
"  command = cat $in > $out\n"
"build ./out.o: catdep ./foo.cc\n"));
  fs_.Create("foo.cc", "");
  fs_.Create("out.o.d", "out.o: foo.cc\n");
  fs_.Create("out.o", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), &err));
  ASSERT_EQ("", err);

  EXPECT_FALSE(GetNode("out.o")->dirty());
}